

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::~Stack
          (Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *this)

{
  long in_RDI;
  VirtualIterator<Kernel::Clause_*> *p;
  VirtualIterator<Kernel::Clause_*> *this_00;
  
  this_00 = *(VirtualIterator<Kernel::Clause_*> **)(in_RDI + 0x10);
  while (this_00 != *(VirtualIterator<Kernel::Clause_*> **)(in_RDI + 8)) {
    this_00 = this_00 + -1;
    VirtualIterator<Kernel::Clause_*>::~VirtualIterator(this_00);
  }
  if (*(long *)(in_RDI + 8) != 0) {
    Lib::free(*(void **)(in_RDI + 8));
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }